

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_passphrase.c
# Opt level: O2

void test_option_passphrase(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_option_passphrase.zip");
  wVar1 = systemf("%s -i --passphrase pass1 < %s >test.out 2>test.err",testprog,
                  "test_option_passphrase.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
                      ,L'\x10',0,"0",(long)wVar1,
                      "systemf(\"%s -i --passphrase pass1 < %s >test.out 2>test.err\", testprog, reffile)"
                      ,(void *)0x0);
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x12',"file1");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x13',"contents of file1.\n","file1");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x14',"file2");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x15',"contents of file2.\n","file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x16',"test.out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_passphrase.c"
             ,L'\x17',"1 block\n","test.err");
  return;
}

Assistant:

DEFINE_TEST(test_option_passphrase)
{
	const char *reffile = "test_option_passphrase.zip";

	extract_reference_file(reffile);
	assertEqualInt(0,
	    systemf("%s -i --passphrase pass1 < %s >test.out 2>test.err",
	    testprog, reffile));

	assertFileExists("file1");
	assertTextFileContents("contents of file1.\n", "file1");
	assertFileExists("file2");
	assertTextFileContents("contents of file2.\n", "file2");
	assertEmptyFile("test.out");
	assertTextFileContents("1 block\n", "test.err");
}